

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text-buffer.cc
# Opt level: O1

void __thiscall TextBuffer::consolidate_layers(TextBuffer *this)

{
  TextBuffer *this_00;
  bool bVar1;
  vector<TextBuffer::Layer_*,_std::allocator<TextBuffer::Layer_*>_> mutable_layers;
  Layer *layer;
  vector<TextBuffer::Layer_*,_std::allocator<TextBuffer::Layer_*>_> local_48;
  Layer *local_30;
  
  local_30 = this->top_layer;
  local_48.super__Vector_base<TextBuffer::Layer_*,_std::allocator<TextBuffer::Layer_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.super__Vector_base<TextBuffer::Layer_*,_std::allocator<TextBuffer::Layer_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.super__Vector_base<TextBuffer::Layer_*,_std::allocator<TextBuffer::Layer_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (Layer **)0x0;
  this_00 = this;
  if (local_30 != (Layer *)0x0) {
    bVar1 = false;
    do {
      if ((bVar1) || (local_30->snapshot_count != 0)) {
        squash_layers(this_00,&local_48);
        bVar1 = true;
        if (local_48.super__Vector_base<TextBuffer::Layer_*,_std::allocator<TextBuffer::Layer_*>_>.
            _M_impl.super__Vector_impl_data._M_finish !=
            local_48.super__Vector_base<TextBuffer::Layer_*,_std::allocator<TextBuffer::Layer_*>_>.
            _M_impl.super__Vector_impl_data._M_start) {
          local_48.super__Vector_base<TextBuffer::Layer_*,_std::allocator<TextBuffer::Layer_*>_>.
          _M_impl.super__Vector_impl_data._M_finish =
               local_48.
               super__Vector_base<TextBuffer::Layer_*,_std::allocator<TextBuffer::Layer_*>_>._M_impl
               .super__Vector_impl_data._M_start;
        }
      }
      else {
        if (local_30 == this->base_layer) {
          squash_layers(this_00,&local_48);
          if (local_48.super__Vector_base<TextBuffer::Layer_*,_std::allocator<TextBuffer::Layer_*>_>
              ._M_impl.super__Vector_impl_data._M_finish !=
              local_48.super__Vector_base<TextBuffer::Layer_*,_std::allocator<TextBuffer::Layer_*>_>
              ._M_impl.super__Vector_impl_data._M_start) {
            local_48.super__Vector_base<TextBuffer::Layer_*,_std::allocator<TextBuffer::Layer_*>_>.
            _M_impl.super__Vector_impl_data._M_finish =
                 local_48.
                 super__Vector_base<TextBuffer::Layer_*,_std::allocator<TextBuffer::Layer_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
          }
        }
        if ((local_30->text).is_some == true) {
          local_30->uses_patch = false;
        }
        if (local_48.super__Vector_base<TextBuffer::Layer_*,_std::allocator<TextBuffer::Layer_*>_>.
            _M_impl.super__Vector_impl_data._M_finish ==
            local_48.super__Vector_base<TextBuffer::Layer_*,_std::allocator<TextBuffer::Layer_*>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          this_00 = (TextBuffer *)&local_48;
          std::vector<TextBuffer::Layer*,std::allocator<TextBuffer::Layer*>>::
          _M_realloc_insert<TextBuffer::Layer*const&>
                    ((vector<TextBuffer::Layer*,std::allocator<TextBuffer::Layer*>> *)&local_48,
                     (iterator)
                     local_48.
                     super__Vector_base<TextBuffer::Layer_*,_std::allocator<TextBuffer::Layer_*>_>.
                     _M_impl.super__Vector_impl_data._M_finish,&local_30);
        }
        else {
          *local_48.super__Vector_base<TextBuffer::Layer_*,_std::allocator<TextBuffer::Layer_*>_>.
           _M_impl.super__Vector_impl_data._M_finish = local_30;
          local_48.super__Vector_base<TextBuffer::Layer_*,_std::allocator<TextBuffer::Layer_*>_>.
          _M_impl.super__Vector_impl_data._M_finish =
               local_48.
               super__Vector_base<TextBuffer::Layer_*,_std::allocator<TextBuffer::Layer_*>_>._M_impl
               .super__Vector_impl_data._M_finish + 1;
        }
      }
      if (local_30->uses_patch == false) {
        bVar1 = false;
      }
      local_30 = local_30->previous_layer;
    } while (local_30 != (Layer *)0x0);
    local_30 = (Layer *)0x0;
  }
  squash_layers(this_00,&local_48);
  if ((Layer *)local_48.
               super__Vector_base<TextBuffer::Layer_*,_std::allocator<TextBuffer::Layer_*>_>._M_impl
               .super__Vector_impl_data._M_start != (Layer *)0x0) {
    operator_delete(local_48.
                    super__Vector_base<TextBuffer::Layer_*,_std::allocator<TextBuffer::Layer_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_48.
                          super__Vector_base<TextBuffer::Layer_*,_std::allocator<TextBuffer::Layer_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.
                          super__Vector_base<TextBuffer::Layer_*,_std::allocator<TextBuffer::Layer_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void TextBuffer::consolidate_layers() {
  Layer *layer = top_layer;
  vector<Layer *> mutable_layers;
  bool needed_by_layer_above = false;

  while (layer) {
    if (needed_by_layer_above || layer->snapshot_count > 0) {
      squash_layers(mutable_layers);
      mutable_layers.clear();
      needed_by_layer_above = true;
    } else {
      if (layer == base_layer) {
        squash_layers(mutable_layers);
        mutable_layers.clear();
      }

      if (layer->text) layer->uses_patch = false;
      mutable_layers.push_back(layer);
    }

    if (!layer->uses_patch) needed_by_layer_above = false;
    layer = layer->previous_layer;
  }

  squash_layers(mutable_layers);
}